

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

bool Rml::Assert(char *msg,char *file,int line)

{
  undefined1 uVar1;
  int iVar2;
  SystemInterface *pSVar3;
  String message;
  
  CreateString_abi_cxx11_(&message,"%s\n%s:%d",msg,file,(ulong)(uint)line);
  pSVar3 = GetSystemInterface();
  if (pSVar3 == (SystemInterface *)0x0) {
    uVar1 = LogDefault::LogMessage(LT_ASSERT,&message);
  }
  else {
    iVar2 = (*pSVar3->_vptr_SystemInterface[5])(pSVar3,2,&message);
    uVar1 = (undefined1)iVar2;
  }
  ::std::__cxx11::string::~string((string *)&message);
  return (bool)uVar1;
}

Assistant:

bool Assert(const char* msg, const char* file, int line)
{
	String message = CreateString("%s\n%s:%d", msg, file, line);

	bool result = true;
	if (SystemInterface* system_interface = GetSystemInterface())
		result = system_interface->LogMessage(Log::LT_ASSERT, message);
	else
		result = LogDefault::LogMessage(Log::LT_ASSERT, message);

	return result;
}